

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dict.cpp
# Opt level: O3

Dictionary * ASDCP::DefaultCompositeDict(void)

{
  if (s_CompositeDictInit == '\0') {
    pthread_mutex_lock((pthread_mutex_t *)&s_CompositeDictLock);
    if (s_CompositeDictInit == '\0') {
      Dictionary::Init(&s_CompositeDict);
      s_CompositeDictInit = '\x01';
    }
    pthread_mutex_unlock((pthread_mutex_t *)&s_CompositeDictLock);
  }
  return &s_CompositeDict;
}

Assistant:

const ASDCP::Dictionary&
ASDCP::DefaultCompositeDict()
{
  if ( ! s_CompositeDictInit )
    {
      Kumu::AutoMutex AL(s_CompositeDictLock);

      if ( ! s_CompositeDictInit )
	{
	  s_CompositeDict.Init();
	  s_CompositeDictInit = true;
	}
    }

  return s_CompositeDict;
}